

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyline.cpp
# Opt level: O3

span<const_mpt::point<double>_> __thiscall mpt::polyline::part::points(part *this)

{
  point *ppVar1;
  long lVar2;
  bool bVar3;
  span<const_mpt::point<double>_> sVar4;
  
  bVar3 = (this->_part)._cut != 0;
  lVar2 = ((ulong)(this->_part).usr - (ulong)bVar3) + -1 + (ulong)((this->_part)._trim == 0);
  ppVar1 = (point *)0x0;
  if (-1 < lVar2) {
    ppVar1 = this->_pts + bVar3;
  }
  sVar4._len = lVar2 * 0x10;
  sVar4._base = ppVar1;
  return sVar4;
}

Assistant:

span<const polyline::point> polyline::part::points() const
{
	size_t len = _part.usr;
	const point *pts = _pts;
	if (_part._cut) {
		++pts;
		--len;
	}
	if (_part._trim) {
		--len;
	}
	return span<const point>(pts, len);
}